

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManIncrSimCone_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if ((~*(uint *)(p->pObjs + (uint)iObj) & 0x9fffffff) != 0) {
    if (p->vTimeStamps->nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = p->vTimeStamps->pArray;
    iVar2 = p->iTimeStamp;
    iVar3 = piVar4[(uint)iObj];
    if (iVar3 != iVar2) {
      if (iVar2 <= iVar3) {
        __assert_fail("Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                      ,0x4ae,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs + (uint)iObj;
      piVar4[(uint)iObj] = iVar2;
      uVar5 = (uint)*(undefined8 *)pGVar1;
      if ((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) {
        Gia_ManIncrSimCone_rec(p,iObj - (uVar5 & 0x1fffffff));
        Gia_ManIncrSimCone_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
        Gia_ManBuiltInSimPerformInt(p,iObj);
        return;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                    ,0x4b0,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
    }
  }
  return;
}

Assistant:

void Gia_ManIncrSimCone_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Vec_IntEntry(p->vTimeStamps, iObj) == p->iTimeStamp )
        return;
    assert( Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp );
    Vec_IntWriteEntry( p->vTimeStamps, iObj, p->iTimeStamp );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Gia_ManBuiltInSimPerformInt( p, iObj );
}